

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg.cpp
# Opt level: O0

void __thiscall spvtools::opt::CFG::ComputeStructuredSuccessors(CFG *this,Function *func)

{
  reference this_00;
  bool bVar1;
  mapped_type *this_01;
  size_type sVar2;
  mapped_type *pmVar3;
  anon_class_16_2_20c29fd4 local_c8;
  function<void_(unsigned_int)> local_b8;
  BasicBlock *local_98;
  value_type *const_blk;
  BasicBlock *local_88;
  uint32_t local_7c;
  BasicBlock *pBStack_78;
  uint32_t cbid;
  BasicBlock *local_70;
  uint32_t local_64;
  reference pvStack_60;
  uint32_t mbid;
  key_type local_58;
  uint32_t local_4c;
  reference local_48;
  value_type *blk;
  iterator __end2;
  iterator __begin2;
  Function *__range2;
  Function *func_local;
  CFG *this_local;
  
  std::
  unordered_map<const_spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>_>
  ::clear(&this->block2structured_succs_);
  join_0x00000010_0x00000000_ = opt::Function::begin(func);
  _blk = opt::Function::end(func);
  while (bVar1 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator!=
                           ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)
                            &__end2.iterator_,
                            (UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&blk), bVar1) {
    local_48 = UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator*
                         ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_)
    ;
    local_4c = BasicBlock::id(local_48);
    this_01 = std::
              unordered_map<unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>_>
              ::operator[](&this->label2preds_,&local_4c);
    sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_01);
    if (sVar2 == 0) {
      local_58 = &this->pseudo_entry_block_;
      pmVar3 = std::
               unordered_map<const_spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>_>
               ::operator[](&this->block2structured_succs_,&local_58);
      pvStack_60 = local_48;
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(pmVar3,&stack0xffffffffffffffa0);
    }
    local_64 = BasicBlock::MergeBlockIdIfAny(local_48);
    if (local_64 != 0) {
      local_70 = local_48;
      pmVar3 = std::
               unordered_map<const_spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>_>
               ::operator[](&this->block2structured_succs_,&local_70);
      pBStack_78 = block(this,local_64);
      std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
      push_back(pmVar3,&stack0xffffffffffffff88);
      local_7c = BasicBlock::ContinueBlockIdIfAny(local_48);
      if (local_7c != 0) {
        local_88 = local_48;
        pmVar3 = std::
                 unordered_map<const_spvtools::opt::BasicBlock_*,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>,_std::hash<const_spvtools::opt::BasicBlock_*>,_std::equal_to<const_spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<const_spvtools::opt::BasicBlock_*const,_std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>_>_>_>
                 ::operator[](&this->block2structured_succs_,&local_88);
        const_blk = block(this,local_7c);
        std::vector<spvtools::opt::BasicBlock_*,_std::allocator<spvtools::opt::BasicBlock_*>_>::
        push_back(pmVar3,&const_blk);
      }
    }
    this_00 = local_48;
    local_98 = local_48;
    local_c8.blk = local_48;
    local_c8.this = this;
    std::function<void(unsigned_int)>::
    function<spvtools::opt::CFG::ComputeStructuredSuccessors(spvtools::opt::Function*)::__0,void>
              ((function<void(unsigned_int)> *)&local_b8,&local_c8);
    BasicBlock::ForEachSuccessorLabel(this_00,&local_b8);
    std::function<void_(unsigned_int)>::~function(&local_b8);
    UptrVectorIterator<spvtools::opt::BasicBlock,_false>::operator++
              ((UptrVectorIterator<spvtools::opt::BasicBlock,_false> *)&__end2.iterator_);
  }
  return;
}

Assistant:

void CFG::ComputeStructuredSuccessors(Function* func) {
  block2structured_succs_.clear();
  for (auto& blk : *func) {
    // If no predecessors in function, make successor to pseudo entry.
    if (label2preds_[blk.id()].size() == 0)
      block2structured_succs_[&pseudo_entry_block_].push_back(&blk);

    // If header, make merge block first successor and continue block second
    // successor if there is one.
    uint32_t mbid = blk.MergeBlockIdIfAny();
    if (mbid != 0) {
      block2structured_succs_[&blk].push_back(block(mbid));
      uint32_t cbid = blk.ContinueBlockIdIfAny();
      if (cbid != 0) {
        block2structured_succs_[&blk].push_back(block(cbid));
      }
    }

    // Add true successors.
    const auto& const_blk = blk;
    const_blk.ForEachSuccessorLabel([&blk, this](const uint32_t sbid) {
      block2structured_succs_[&blk].push_back(block(sbid));
    });
  }
}